

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_smul_dual(TCGContext_conflict1 *tcg_ctx,TCGv_i32 a,TCGv_i32 b)

{
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret,a);
  tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret_00,b);
  tcg_gen_mul_i32(tcg_ctx,ret,ret,ret_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_gen_sari_i32_aarch64(tcg_ctx,a,a,0x10);
  tcg_gen_sari_i32_aarch64(tcg_ctx,b,b,0x10);
  tcg_gen_mul_i32(tcg_ctx,b,b,a);
  tcg_gen_mov_i32(tcg_ctx,a,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_smul_dual(TCGContext *tcg_ctx, TCGv_i32 a, TCGv_i32 b)
{
    TCGv_i32 tmp1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 tmp2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext16s_i32(tcg_ctx, tmp1, a);
    tcg_gen_ext16s_i32(tcg_ctx, tmp2, b);
    tcg_gen_mul_i32(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);
    tcg_gen_sari_i32(tcg_ctx, a, a, 16);
    tcg_gen_sari_i32(tcg_ctx, b, b, 16);
    tcg_gen_mul_i32(tcg_ctx, b, b, a);
    tcg_gen_mov_i32(tcg_ctx, a, tmp1);
    tcg_temp_free_i32(tcg_ctx, tmp1);
}